

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_list.cpp
# Opt level: O0

void __thiscall Am_Priority_List::Make_Empty(Am_Priority_List *this)

{
  Am_Priority_List_Item *pAVar1;
  Am_Priority_List_Item *local_20;
  Am_Priority_List_Item *p;
  Am_Priority_List_Item *item;
  Am_Priority_List *this_local;
  
  pAVar1 = this->head;
  while (local_20 = pAVar1, local_20 != (Am_Priority_List_Item *)0x0) {
    pAVar1 = local_20->next;
    if (local_20 != (Am_Priority_List_Item *)0x0) {
      Am_Priority_List_Item::~Am_Priority_List_Item(local_20);
      operator_delete(local_20);
    }
  }
  this->head = (Am_Priority_List_Item *)0x0;
  this->tail = (Am_Priority_List_Item *)0x0;
  this->current = (Am_Priority_List_Item *)0x0;
  return;
}

Assistant:

void
Am_Priority_List::Make_Empty()
{
  Am_Priority_List_Item *item;
  Am_Priority_List_Item *p = head;
  while (p) {
    item = p;
    p = p->next;
    delete item;
  }
  head = nullptr;
  tail = nullptr;
  current = nullptr;
}